

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O3

void __thiscall
TreePropagator::walkBrokenBridges
          (TreePropagator *this,int r,vector<bool,_std::allocator<bool>_> *reachable,
          vector<bool,_std::allocator<bool>_> *walked,vector<bool,_std::allocator<bool>_> *visited,
          int avoidBridge,vector<int,_std::allocator<int>_> *bridges,bool isArt,int parent)

{
  ulong *puVar1;
  uint r_00;
  pointer pvVar2;
  uint *puVar3;
  BoolView *pBVar4;
  iterator __position;
  bool bVar5;
  int iVar6;
  pointer piVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  int e;
  vector<bool,_std::allocator<bool>_> *local_38;
  
  uVar9 = (ulong)r;
  iVar6 = r + 0x3f;
  if (-1 < r) {
    iVar6 = r;
  }
  puVar1 = (visited->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p +
           (long)(iVar6 >> 6) +
           (ulong)((uVar9 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff;
  *puVar1 = *puVar1 | 1L << ((byte)r & 0x3f);
  pvVar2 = (this->super_GraphPropagator).adj.
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar7 = pvVar2[uVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&pvVar2[uVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data + 8) != piVar7) {
    uVar10 = 0;
    uVar13 = 1;
    do {
      e = piVar7[uVar10];
      puVar3 = *(uint **)&(this->super_GraphPropagator).endnodes.
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[e].
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data;
      r_00 = *puVar3;
      if (r_00 == r) {
        r_00 = puVar3[1];
      }
      if (((r_00 != avoidBridge || !isArt) && (isArt || e != avoidBridge)) && (r_00 != parent)) {
        pBVar4 = (this->super_GraphPropagator).es.data;
        if ((sat.assigns.data[(uint)pBVar4[(uint)e].v] != '\0') &&
           ((uint)pBVar4[(uint)e].s * 2 + -1 == (int)sat.assigns.data[(uint)pBVar4[(uint)e].v])) {
          uVar8 = r_00 + 0x3f;
          if (-1 < (int)r_00) {
            uVar8 = r_00;
          }
          lVar11 = (long)((int)uVar8 >> 6);
          uVar10 = (ulong)(((long)(int)r_00 & 0x800000000000003fU) < 0x8000000000000001);
          uVar12 = 1L << ((byte)r_00 & 0x3f);
          if (((((reachable->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [lVar11 + uVar10 + 0xffffffffffffffff] >> ((ulong)r_00 & 0x3f) & 1) != 0) &&
              (((walked->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                [lVar11 + uVar10 + 0xffffffffffffffff] & uVar12) == 0)) &&
             (((visited->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
               [lVar11 + uVar10 + 0xffffffffffffffff] & uVar12) == 0)) {
            __position._M_current =
                 (bridges->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (bridges->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              local_38 = visited;
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)bridges,__position,&e);
              visited = local_38;
            }
            else {
              *__position._M_current = e;
              (bridges->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            goto LAB_001724fa;
          }
        }
        uVar8 = r_00 + 0x3f;
        if (-1 < (int)r_00) {
          uVar8 = r_00;
        }
        if (((visited->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p
             [(long)((int)uVar8 >> 6) +
              (ulong)(((long)(int)r_00 & 0x800000000000003fU) < 0x8000000000000001) +
              0xffffffffffffffff] >> ((ulong)r_00 & 0x3f) & 1) == 0) {
          walkBrokenBridges(this,r_00,reachable,walked,visited,avoidBridge,bridges,isArt,r);
        }
      }
LAB_001724fa:
      pvVar2 = (this->super_GraphPropagator).adj.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar7 = pvVar2[uVar9].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar5 = uVar13 < (ulong)((long)*(pointer *)
                                      ((long)&pvVar2[uVar9].
                                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                              super__Vector_impl_data + 8) - (long)piVar7 >> 2);
      uVar10 = uVar13;
      uVar13 = (ulong)((int)uVar13 + 1);
    } while (bVar5);
  }
  return;
}

Assistant:

void TreePropagator::walkBrokenBridges(int r, std::vector<bool>& reachable,
																			 std::vector<bool>& walked, std::vector<bool>& visited,
																			 int avoidBridge, std::vector<edge_id>& bridges, bool isArt,
																			 int parent) {
	// cout << "Walking my island again.... :" << r<<" "<<avoidBridge<<endl;
	visited[r] = true;
	for (unsigned int i = 0; i < adj[r].size(); i++) {
		const int e = adj[r][i];
		const int e1 = getEndnode(e, 1);
		const int e0 = getEndnode(e, 0);
		const int other = e0 == r ? e1 : e0;
		if (isArt && other == avoidBridge) {
			continue;
		}
		if (!isArt && e == avoidBridge) {
			continue;
		}
		if (other == parent) {
			continue;
		}
		if (getEdgeVar(e).isFixed() && getEdgeVar(e).isFalse()) {
			// cout << other<<" "<<reachable[other] <<" "<< walked[other]<<endl;
			if (reachable[other] && !walked[other] && !visited[other]) {
				bridges.push_back(e);
				continue;
			}
		}
		if (!visited[other]) {
			walkBrokenBridges(other, reachable, walked, visited, avoidBridge, bridges, isArt, r);
		}
	}
}